

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

bool __thiscall wasm::WasmValidator::validate(WasmValidator *this,Module *module,Flags flags)

{
  Name *pNVar1;
  __node_base_ptr *pp_Var2;
  tuple<wasm::Function_*,_std::default_delete<wasm::Function>_> func;
  pointer puVar3;
  DataSegment *pDVar4;
  pointer puVar5;
  Export *pEVar6;
  Expression *pEVar7;
  uintptr_t uVar8;
  pointer puVar9;
  long lVar10;
  Type left;
  pointer ppEVar11;
  pointer puVar12;
  ElementSegment *pEVar13;
  __uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_> _Var14;
  pointer puVar15;
  __uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> _Var16;
  long *plVar17;
  Name NVar18;
  undefined **ppuVar19;
  pointer puVar20;
  bool bVar21;
  FeatureSet FVar22;
  int iVar23;
  Type *pTVar24;
  Type *pTVar25;
  Tuple *pTVar26;
  Function *pFVar27;
  Global *pGVar28;
  pointer puVar29;
  size_type sVar30;
  ostringstream *this_00;
  ostream *poVar31;
  size_type sVar32;
  Memory *pMVar33;
  Table *pTVar34;
  Type *pTVar35;
  const_iterator cVar36;
  iterator iVar37;
  char *pcVar38;
  Module *pMVar39;
  pointer puVar40;
  pointer pHVar41;
  byte bVar42;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import_1;
  pointer puVar43;
  pointer puVar44;
  pointer ppEVar45;
  pointer puVar46;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  ulong uVar47;
  pointer puVar48;
  pointer puVar49;
  long *plVar50;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment_1;
  HeapType HVar51;
  pointer puVar52;
  pointer puVar53;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  bool result;
  Signature SVar54;
  Name name_00;
  Name name_01;
  Name name_02;
  PassRunner local_4a8;
  pointer local_390;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_388;
  key_type local_370;
  HeapType type;
  Iterator __begin3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 local_338 [184];
  pointer pTStack_280;
  pointer local_278;
  Function *pFStack_270;
  Module *local_268;
  undefined1 *local_260;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_258;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_220;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1e8;
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b0;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_178;
  undefined1 local_140 [8];
  ValidationInfo info;
  Type externref;
  __node_base local_c0 [2];
  undefined1 local_b0 [8];
  Type funcref;
  undefined8 local_a0;
  undefined **local_90;
  undefined1 auStack_88 [8];
  string name;
  __node_base_ptr p_Stack_58;
  Type local_50;
  HeapType *local_48;
  HeapType *local_40;
  Module *local_38;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  
  info.validateWeb = false;
  info.validateGlobally = false;
  info.quiet = false;
  info.closedWorld = false;
  info.valid._M_base._M_i = (__atomic_base<bool>)0x0;
  info._13_3_ = 0;
  info.mutex.super___mutex_base._M_mutex.__align = 0;
  info.mutex.super___mutex_base._M_mutex._8_8_ = 0;
  info.mutex.super___mutex_base._M_mutex._16_8_ = 0;
  info.mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  info.mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)&info.outputs._M_h._M_rehash_policy._M_next_resize;
  info.outputs._M_h._M_buckets = (__buckets_ptr)0x1;
  info.outputs._M_h._M_bucket_count = 0;
  info.outputs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  info.outputs._M_h._M_element_count._0_4_ = 0x3f800000;
  info.outputs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  info.outputs._M_h._M_rehash_policy._4_4_ = 0;
  info.outputs._M_h._M_rehash_policy._M_next_resize = 0;
  LOCK();
  info.wasm._4_1_ = 1;
  UNLOCK();
  bVar42 = (byte)flags;
  info.wasm._0_1_ = bVar42 & 1;
  info.wasm._1_1_ = bVar42 >> 1 & 1;
  info.wasm._2_1_ = bVar42 >> 2 & 1;
  info.wasm._3_1_ = bVar42 >> 3 & 1;
  local_4a8.options.arguments._M_h._M_buckets = &local_4a8.options.arguments._M_h._M_single_bucket;
  local_4a8._vptr_PassRunner = (_func_int **)&PTR__PassRunner_00d875f8;
  local_4a8.allocator = &module->allocator;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4a8._41_8_ = 0;
  local_4a8.options.validate = true;
  local_4a8.options.validateGlobally = true;
  local_4a8.options.optimizeLevel = 0;
  local_4a8.options.shrinkLevel = 0;
  local_4a8.options.inlining.alwaysInlineMaxSize = 2;
  local_4a8.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_4a8.options.inlining.flexibleInlineMaxSize = 0x14;
  local_4a8.options.inlining.allowFunctionsWithLoops = false;
  local_4a8.options.inlining.partialInliningIfs = 0;
  local_4a8.options.ignoreImplicitTraps = false;
  local_4a8.options.trapsNeverHappen = false;
  local_4a8.options.lowMemoryUnused = false;
  local_4a8.options.fastMath = false;
  local_4a8.options.zeroFilledMemory = false;
  local_4a8.options.closedWorld = false;
  local_4a8.options.debugInfo = false;
  local_4a8.options.targetJS = false;
  local_4a8.options.arguments._M_h._M_bucket_count = 1;
  local_4a8.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4a8.options.arguments._M_h._M_element_count = 0;
  local_4a8.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_4a8.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_4a8.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_4a8.options.passesToSkip._M_h._M_buckets =
       &local_4a8.options.passesToSkip._M_h._M_single_bucket;
  local_4a8.options.passesToSkip._M_h._M_bucket_count = 1;
  local_4a8.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4a8.options.passesToSkip._M_h._M_element_count = 0;
  local_4a8.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_4a8.skippedPasses._M_h._M_buckets = &local_4a8.skippedPasses._M_h._M_single_bucket;
  local_4a8.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_4a8.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_7_ = 0;
  local_4a8._215_4_ = 0;
  local_4a8.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_4a8.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_4a8.skippedPasses._M_h._M_bucket_count = 1;
  local_4a8.skippedPasses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4a8.skippedPasses._M_h._M_element_count = 0;
  local_4a8.skippedPasses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_4a8.skippedPasses._M_h._M_rehash_policy._M_next_resize = 0;
  local_4a8.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)&local_348;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_348._M_allocated_capacity._0_4_ = local_348._M_allocated_capacity._0_4_ & 0xffffff00;
  local_338._0_8_ = (__node_base_ptr)0x0;
  local_338._8_8_ = (Expression **)0x0;
  local_338._176_8_ =
       (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        *)0x0;
  pTStack_280 = (pointer)0x0;
  local_278 = (pointer)0x0;
  pFStack_270 = (Function *)0x0;
  type.id = (uintptr_t)&PTR__FunctionValidator_00d8b828;
  local_260 = local_140;
  _Stack_258._M_buckets = &_Stack_258._M_single_bucket;
  _Stack_258._M_bucket_count = 1;
  _Stack_258._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_258._M_element_count = 0;
  _Stack_258._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_258._M_rehash_policy._M_next_resize = 0;
  _Stack_258._M_single_bucket = (__node_base_ptr)0x0;
  local_220._M_buckets = &local_220._M_single_bucket;
  local_220._M_bucket_count = 1;
  local_220._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_220._M_element_count = 0;
  local_220._M_rehash_policy._M_max_load_factor = 1.0;
  local_220._M_rehash_policy._M_next_resize = 0;
  local_220._M_single_bucket = (__node_base_ptr)0x0;
  local_1e8._M_buckets = &local_1e8._M_single_bucket;
  local_1e8._M_bucket_count = 1;
  local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1e8._M_element_count = 0;
  local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1e8._M_rehash_policy._M_next_resize = 0;
  local_1e8._M_single_bucket = (__node_base_ptr)0x0;
  local_1b0._M_buckets = &local_1b0._M_single_bucket;
  local_1b0._M_bucket_count = 1;
  local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0._M_element_count = 0;
  local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1b0._M_rehash_policy._M_next_resize = 0;
  local_1b0._M_single_bucket = (__node_base_ptr)0x0;
  local_178._M_buckets = &local_178._M_single_bucket;
  local_178._M_bucket_count = 1;
  local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_178._M_element_count = 0;
  local_178._M_rehash_policy._M_max_load_factor = 1.0;
  local_178._M_rehash_policy._M_next_resize = 0;
  local_178._M_single_bucket = (__node_base_ptr)0x0;
  local_4a8.wasm = module;
  local_268 = module;
  local_140 = (undefined1  [8])module;
  local_38 = module;
  WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
         *)&type,&local_4a8,module);
  local_90 = &PTR__FunctionValidator_00d8b828;
  type.id = (uintptr_t)&PTR__FunctionValidator_00d8b828;
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_178);
  std::
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1b0);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1e8);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_220);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&_Stack_258);
  if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_338._176_8_ !=
      (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    operator_delete((void *)local_338._176_8_,(long)local_278 - local_338._176_8_);
  }
  pMVar39 = local_38;
  local_50.id = (uintptr_t)&PTR__Pass_00d87048;
  type.id = (uintptr_t)&PTR__Pass_00d87048;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index !=
      &local_348) {
    operator_delete((void *)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,
                    CONCAT44(local_348._M_allocated_capacity._4_4_,
                             local_348._M_allocated_capacity._0_4_) + 1);
  }
  if (info.wasm._1_1_ == 1) {
    puVar29 = (pMVar39->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (HeapType *)
               (pMVar39->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar29 != (pointer)local_48) {
      do {
        func.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (puVar29->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>;
        if (*(char **)((long)func.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) !=
            (char *)0x0) {
          local_40 = (HeapType *)
                     ((long)func.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38);
          SVar54 = HeapType::getSignature(local_40);
          type.id = (uintptr_t)SVar54.results.id;
          bVar21 = wasm::Type::isTuple((Type *)&type);
          if (bVar21) {
            ValidationInfo::shouldBeTrue<wasm::Name>
                      ((ValidationInfo *)local_140,
                       (bool)((byte)((local_38->features).features >> 9) & 1),
                       (IString)*(IString *)
                                 func.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                       "Imported multivalue function requires multivalue [--enable-multivalue]",
                       (Function *)0x0);
          }
          if ((byte)info.wasm == 1) {
            SVar54 = HeapType::getSignature(local_40);
            auStack_88 = (undefined1  [8])SVar54.params.id;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            type.id = (uintptr_t)auStack_88;
            pTVar24 = (Type *)wasm::Type::size((Type *)auStack_88);
            if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                == pTVar24) goto LAB_009d7369;
            do {
              do {
                pTVar25 = wasm::Type::Iterator::operator*((Iterator *)&type);
                ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                          ((ValidationInfo *)local_140,(Type)pTVar25->id,(Type)0x3,
                           (IString)*(IString *)
                                     func.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                           "Imported function must not have i64 parameters",(Function *)0x0);
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1);
              } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       parent != pTVar24);
LAB_009d7369:
            } while ((Type *)type.id != (Type *)auStack_88);
            SVar54 = HeapType::getSignature(local_40);
            auStack_88 = (undefined1  [8])SVar54.results.id;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            type.id = (uintptr_t)auStack_88;
            pTVar24 = (Type *)wasm::Type::size((Type *)auStack_88);
            if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                == pTVar24) goto LAB_009d73ff;
            do {
              do {
                pTVar25 = wasm::Type::Iterator::operator*((Iterator *)&type);
                ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                          ((ValidationInfo *)local_140,(Type)pTVar25->id,(Type)0x3,
                           (IString)*(IString *)
                                     func.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                           "Imported function must not have i64 results",(Function *)0x0);
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1);
              } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       parent != pTVar24);
LAB_009d73ff:
            } while ((Type *)type.id != (Type *)auStack_88);
          }
          type.id = (uintptr_t)local_38;
          bVar21 = Intrinsics::isCallWithoutEffects
                             ((Intrinsics *)&type,
                              (Function *)
                              func.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          if (bVar21) {
            SVar54 = HeapType::getSignature(local_40);
            type.id = (uintptr_t)SVar54.params.id;
            bVar21 = wasm::Type::isTuple((Type *)&type);
            if (bVar21) {
              pTVar26 = wasm::Type::getTuple((Type *)&type);
              type.id = (pTVar26->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].id;
            }
            bVar21 = wasm::Type::isFunction((Type *)&type);
            ValidationInfo::shouldBeTrue<wasm::Name>
                      ((ValidationInfo *)local_140,bVar21,
                       (IString)*(IString *)
                                 func.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                       "call.if.used\'s last param must be a function",(Function *)0x0);
          }
        }
        puVar29 = puVar29 + 1;
      } while (puVar29 != (pointer)local_48);
    }
    puVar43 = (local_38->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (local_38->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar43 != puVar3) {
      puVar29 = (pointer)0x0;
      do {
        pGVar28 = (puVar43->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar28->super_Importable).module + 8) != (char *)0x0) {
          if (((local_38->features).features & 2) == 0) {
            ValidationInfo::shouldBeFalse<wasm::Name>
                      ((ValidationInfo *)local_140,pGVar28->mutable_,
                       (IString)*(IString *)&(pGVar28->super_Importable).super_Named,
                       "Imported mutable global requires mutable-globals [--enable-mutable-globals]"
                       ,(Function *)0x0);
          }
          bVar21 = wasm::Type::isTuple(&pGVar28->type);
          ValidationInfo::shouldBeFalse<wasm::Name>
                    ((ValidationInfo *)local_140,bVar21,
                     (IString)*(IString *)&(pGVar28->super_Importable).super_Named,
                     "Imported global cannot be tuple",(Function *)0x0);
        }
        puVar43 = puVar43 + 1;
      } while (puVar43 != puVar3);
    }
    puVar40 = (pointer)(local_38->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (HeapType *)
               (local_38->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar40 != (pointer)local_40) {
      do {
        pDVar4 = (puVar40->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        iVar23 = *(int *)((long)&(pDVar4->memory).super_IString + 8);
        if (iVar23 == 3) {
          pGVar28 = Module::getGlobalOrNull
                              (local_38,(Name)*(string_view *)&(pDVar4->super_Named).hasExplicitName
                              );
          if (pGVar28 != (Global *)0x0) {
            if (((local_38->features).features & 2) == 0) {
              ValidationInfo::shouldBeFalse<wasm::Name>
                        ((ValidationInfo *)local_140,pGVar28->mutable_,
                         (Name)(pGVar28->super_Importable).super_Named.name.super_IString.str,
                         "Exported mutable global requires mutable-globals [--enable-mutable-globals]"
                         ,(Function *)0x0);
            }
            bVar21 = wasm::Type::isTuple(&pGVar28->type);
            ValidationInfo::shouldBeFalse<wasm::Name>
                      ((ValidationInfo *)local_140,bVar21,
                       (Name)(pGVar28->super_Importable).super_Named.name.super_IString.str,
                       "Exported global cannot be tuple",(Function *)0x0);
          }
        }
        else if ((iVar23 == 0) && ((byte)info.wasm == 1)) {
          pFVar27 = Module::getFunction(local_38,(Name)*(string_view *)
                                                        &(pDVar4->super_Named).hasExplicitName);
          local_48 = &pFVar27->type;
          SVar54 = HeapType::getSignature(local_48);
          auStack_88 = (undefined1  [8])SVar54.params.id;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          type.id = (uintptr_t)auStack_88;
          pTVar24 = (Type *)wasm::Type::size((Type *)auStack_88);
          if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
              pTVar24) goto LAB_009d7668;
          do {
            do {
              pTVar25 = wasm::Type::Iterator::operator*((Iterator *)&type);
              ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                        ((ValidationInfo *)local_140,(Type)pTVar25->id,(Type)0x3,
                         (Name)(pFVar27->super_Importable).super_Named.name.super_IString.str,
                         "Exported function must not have i64 parameters",(Function *)0x0);
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar24);
LAB_009d7668:
          } while ((Type *)type.id != (Type *)auStack_88);
          SVar54 = HeapType::getSignature(local_48);
          auStack_88 = (undefined1  [8])SVar54.results.id;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          type.id = (uintptr_t)auStack_88;
          puVar29 = (pointer)wasm::Type::size((Type *)auStack_88);
          if ((pointer)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       parent == puVar29) goto LAB_009d76fe;
          do {
            do {
              pTVar24 = wasm::Type::Iterator::operator*((Iterator *)&type);
              ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                        ((ValidationInfo *)local_140,(Type)pTVar24->id,(Type)0x3,
                         (Name)(pFVar27->super_Importable).super_Named.name.super_IString.str,
                         "Exported function must not have i64 results",(Function *)0x0);
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while ((pointer)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent != puVar29);
LAB_009d76fe:
          } while ((Type *)type.id != (Type *)auStack_88);
        }
        puVar40 = puVar40 + 1;
      } while (puVar40 != (pointer)local_40);
    }
    type.id = (uintptr_t)local_338;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x1;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    local_348._M_allocated_capacity._0_4_ = 0x3f800000;
    local_348._8_8_ = 0;
    local_338._0_8_ = (__node_base_ptr)0x0;
    puVar44 = (local_38->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (local_38->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar44 != puVar5) {
      do {
        pEVar6 = (puVar44->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (4 < (uint)pEVar6->kind) {
          handle_unreachable("invalid ExternalKind",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                             ,0xcf0);
        }
        pNVar1 = &pEVar6->value;
        puVar29 = *(pointer *)((long)&(pEVar6->value).super_IString + 8);
        NVar18.super_IString.str = pNVar1->super_IString;
        switch(pEVar6->kind) {
        case Function:
          pFVar27 = Module::getFunctionOrNull(local_38,(IString)pNVar1->super_IString);
          pcVar38 = "module function exports must be found";
          break;
        case Table:
          pFVar27 = (Function *)Module::getTableOrNull(local_38,(IString)pNVar1->super_IString);
          pcVar38 = "module table exports must be found";
          break;
        case Memory:
          pFVar27 = (Function *)Module::getMemoryOrNull(local_38,(IString)pNVar1->super_IString);
          pcVar38 = "module memory exports must be found";
          break;
        case Global:
          pFVar27 = (Function *)Module::getGlobalOrNull(local_38,(IString)pNVar1->super_IString);
          pcVar38 = "module global exports must be found";
          break;
        case Tag:
          pFVar27 = (Function *)Module::getTagOrNull(local_38,(IString)pNVar1->super_IString);
          pcVar38 = "module tag exports must be found";
        }
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_140,pFVar27 != (Function *)0x0,NVar18,pcVar38,
                   (Function *)0x0);
        pEVar6 = (puVar44->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        auStack_88 = *(undefined1 (*) [8])&(pEVar6->name).super_IString;
        name._M_dataplus._M_p = *(char **)((long)&(pEVar6->name).super_IString + 8);
        sVar30 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&type,(key_type *)auStack_88);
        NVar18.super_IString.str._M_str = name._M_dataplus._M_p;
        NVar18.super_IString.str._M_len = (size_t)auStack_88;
        ValidationInfo::shouldBeFalse<wasm::Name>
                  ((ValidationInfo *)local_140,sVar30 != 0,NVar18,"module exports must be unique",
                   (Function *)0x0);
        info.outputs._M_h._M_single_bucket = (__node_base_ptr)&type;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)info.outputs._M_h._M_single_bucket,(key_type *)auStack_88,
                   &info.outputs._M_h._M_single_bucket);
        puVar44 = puVar44 + 1;
      } while (puVar44 != puVar5);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&type);
    auStack_88 = (undefined1  [8])&p_Stack_58;
    name._M_dataplus._M_p = (pointer)0x1;
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = 0;
    name.field_2._8_4_ = 0x3f800000;
    p_Stack_58 = (__node_base_ptr)0x0;
    puVar52 = (pointer)(local_38->globals).
                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    pMVar39 = local_38;
    for (puVar40 = (pointer)(local_38->globals).
                            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; puVar40 != puVar52;
        puVar40 = puVar40 + 1) {
      pDVar4 = (puVar40->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (*(char **)((long)&(pDVar4->memory).super_IString + 8) == (char *)0x0) {
        local_b0 = (undefined1  [8])pDVar4;
        FVar22 = wasm::Type::getFeatures((Type *)&pDVar4->data);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_140,
                   (FVar22.features & ~(pMVar39->features).features) == 0,
                   (Name)*(string_view *)local_b0,"all used types should be allowed",(Function *)0x0
                  );
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_140,((string_view *)((long)local_b0 + 0x40))->_M_len != 0
                   ,(Name)*(string_view *)local_b0,"global init must be non-null",(Function *)0x0);
        pEVar7 = (Expression *)((string_view *)((long)local_b0 + 0x40))->_M_len;
        local_40 = (HeapType *)puVar40;
        if (pEVar7 == (Expression *)0x0) {
          __assert_fail("curr->init",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                        ,0xd02,
                        "auto wasm::validateGlobals(Module &, ValidationInfo &)::(anonymous class)::operator()(Global *) const"
                       );
        }
        local_48 = (HeapType *)CONCAT44(local_48._4_4_,pEVar7->_id);
        if (pEVar7->_id == TupleMakeId) {
          uVar8 = pEVar7[1].type.id;
          puVar29 = (pointer)(ulong)(uVar8 == 0);
          if (uVar8 != 0) {
            uVar47 = 0;
            do {
              if (pEVar7[1].type.id <= uVar47) {
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              bVar21 = Properties::isValidConstantExpression
                                 (local_38,*(Expression **)(*(long *)(pEVar7 + 1) + uVar47 * 8));
              if (!bVar21) break;
              uVar47 = uVar47 + 1;
              puVar29 = (pointer)(ulong)(uVar8 == uVar47);
            } while (uVar8 != uVar47);
          }
        }
        pMVar39 = local_38;
        puVar40 = (pointer)local_40;
        if ((int)local_48 != 0x34) {
          bVar21 = Properties::isValidConstantExpression(local_38,pEVar7);
          puVar29 = (pointer)(ulong)bVar21;
        }
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_140,(bool)((byte)puVar29 & 1),
                   (Name)*(string_view *)local_b0,"global init must be constant",(Function *)0x0);
        pEVar7 = *(Expression **)((long)local_b0 + 0x40);
        bVar21 = wasm::Type::isSubType
                           ((Type)(pEVar7->type).id,
                            (Type)(((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)&((vector<char,_std::allocator<char>_> *)
                                        ((long)local_b0 + 0x38))->
                                        super__Vector_base<char,_std::allocator<char>_>)->_M_impl).
                                  super__Vector_impl_data._M_start);
        if (!bVar21) {
          pcVar38 = (char *)0x0;
          ValidationInfo::fail<wasm::Expression*,char_const*>
                    ((ValidationInfo *)local_140,"global init must have correct type",pEVar7,
                     (Function *)0x0);
          if (info.wasm._2_1_ == 0) {
            this_00 = ValidationInfo::getStream_abi_cxx11_
                                ((ValidationInfo *)local_140,(Function *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(on global ",0xb)
            ;
            name_02.super_IString.str._M_str = pcVar38;
            name_02.super_IString.str._M_len = (size_t)*(char **)((long)local_b0 + 8);
            poVar31 = wasm::operator<<((wasm *)this_00,*(ostream **)local_b0,name_02);
            std::__ostream_insert<char,std::char_traits<char>>(poVar31,")\n",2);
          }
        }
        ppuVar19 = local_90;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)&local_348;
        local_348._M_allocated_capacity._0_4_ = local_348._M_allocated_capacity._0_4_ & 0xffffff00;
        local_338._0_8_ = (__node_base_ptr)0x0;
        local_338._8_8_ = (Expression **)0x0;
        local_278 = (pointer)0x0;
        pFStack_270 = (Function *)0x0;
        local_338._176_8_ =
             (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)0x0;
        pTStack_280 = (pointer)0x0;
        type.id = (uintptr_t)local_90;
        local_260 = local_140;
        _Stack_258._M_buckets = &_Stack_258._M_single_bucket;
        _Stack_258._M_bucket_count = 1;
        _Stack_258._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        _Stack_258._M_element_count = 0;
        _Stack_258._M_rehash_policy._M_max_load_factor = 1.0;
        _Stack_258._M_rehash_policy._M_next_resize = 0;
        _Stack_258._M_single_bucket = (__node_base_ptr)0x0;
        local_220._M_buckets = &local_220._M_single_bucket;
        local_220._M_bucket_count = 1;
        local_220._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_220._M_element_count = 0;
        local_220._M_rehash_policy._M_max_load_factor = 1.0;
        local_220._M_rehash_policy._M_next_resize = 0;
        local_220._M_single_bucket = (__node_base_ptr)0x0;
        local_1e8._M_buckets = &local_1e8._M_single_bucket;
        local_1e8._M_bucket_count = 1;
        local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1e8._M_element_count = 0;
        local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
        local_1e8._M_rehash_policy._M_next_resize = 0;
        local_1e8._M_single_bucket = (__node_base_ptr)0x0;
        local_1b0._M_buckets = &local_1b0._M_single_bucket;
        local_1b0._M_bucket_count = 1;
        local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1b0._M_element_count = 0;
        local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
        local_1b0._M_rehash_policy._M_next_resize = 0;
        local_1b0._M_single_bucket = (__node_base_ptr)0x0;
        local_178._M_buckets = &local_178._M_single_bucket;
        local_178._M_bucket_count = 1;
        local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_178._M_element_count = 0;
        local_178._M_rehash_policy._M_max_load_factor = 1.0;
        local_178._M_rehash_policy._M_next_resize = 0;
        local_178._M_single_bucket = (__node_base_ptr)0x0;
        local_268 = pMVar39;
        info.outputs._M_h._M_single_bucket = *(__node_base_ptr *)((long)local_b0 + 0x40);
        Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                  ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *
                   )local_338,(Expression **)&info.outputs._M_h._M_single_bucket);
        type.id = (uintptr_t)ppuVar19;
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_178);
        std::
        _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_1b0);
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_1e8);
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_220);
        std::
        _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&_Stack_258);
        if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)local_338._176_8_ !=
            (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)0x0) {
          operator_delete((void *)local_338._176_8_,(long)local_278 - local_338._176_8_);
        }
        type.id = local_50.id;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index !=
            &local_348) {
          operator_delete((void *)__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index,
                          CONCAT44(local_348._M_allocated_capacity._4_4_,
                                   local_348._M_allocated_capacity._0_4_) + 1);
        }
        if ((((pMVar39->features).features & 0x400) != 0) &&
           (*(Expression **)((long)local_b0 + 0x40) != (Expression *)0x0)) {
          FindAll<wasm::GlobalGet>::FindAll
                    ((FindAll<wasm::GlobalGet> *)&type,*(Expression **)((long)local_b0 + 0x40));
          puVar29 = (pointer)__begin3.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent;
          for (HVar51 = type; (pointer)HVar51.id != puVar29; HVar51.id = HVar51.id + 8) {
            info.outputs._M_h._M_single_bucket =
                 (__node_base_ptr)
                 Module::getGlobalOrNull
                           (pMVar39,(Name)((IString *)(((Type *)HVar51.id)->id + 0x10))->str);
            if ((Global *)info.outputs._M_h._M_single_bucket == (Global *)0x0) {
              bVar21 = false;
            }
            else {
              sVar32 = std::
                       _Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)auStack_88,(key_type *)&info.outputs._M_h._M_single_bucket);
              bVar21 = true;
              if (sVar32 == 0) {
                bVar21 = info.outputs._M_h._M_single_bucket[4]._M_nxt != (_Hash_node_base *)0x0;
              }
            }
            ValidationInfo::shouldBeTrue<wasm::Expression*>
                      ((ValidationInfo *)local_140,bVar21,*(Expression **)((long)local_b0 + 0x40),
                       "global initializer should only refer to previous globals",(Function *)0x0);
          }
          if (type.id != 0) {
            operator_delete((void *)type.id,
                            __begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index - type.id);
          }
          type.id = (uintptr_t)auStack_88;
          std::
          _Hashtable<wasm::Global*,wasm::Global*,std::allocator<wasm::Global*>,std::__detail::_Identity,std::equal_to<wasm::Global*>,std::hash<wasm::Global*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::Global*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Global*,false>>>>
                    ((_Hashtable<wasm::Global*,wasm::Global*,std::allocator<wasm::Global*>,std::__detail::_Identity,std::equal_to<wasm::Global*>,std::hash<wasm::Global*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)type.id,local_b0,&type);
        }
      }
    }
    std::
    _Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)auStack_88);
    if (8 < (ulong)((long)(pMVar39->memories).
                          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar39->memories).
                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_140,
                 (bool)((byte)((local_38->features).features >> 0x10) & 1),"memory",
                 "multiple memories require multi-memories [--enable-multi-memories]",
                 (Function *)0x0);
    }
    puVar48 = (local_38->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (local_38->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar48 != puVar9) {
      do {
        pMVar33 = (puVar48->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        uVar47 = (pMVar33->max).addr;
        if (uVar47 != 0xffffffffffffffff) {
          ValidationInfo::shouldBeFalse<char_const*>
                    ((ValidationInfo *)local_140,uVar47 < (pMVar33->initial).addr,"memory",
                     "memory max >= initial",(Function *)0x0);
        }
        pMVar33 = (puVar48->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        if ((pMVar33->indexType).id == 3) {
          bVar21 = (bool)((*(byte *)((long)&(local_38->features).features + 1) & 8) >> 3);
          pcVar38 = "64-bit memories require memory64 [--enable-memory64]";
        }
        else {
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,(pMVar33->initial).addr < 0x10001,"memory",
                     "initial memory must be <= 4GB",(Function *)0x0);
          bVar21 = (((puVar48->_M_t).
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->max).addr + 1 <
                   0x10002;
          pcVar38 = "max memory must be <= 4GB, or unlimited";
        }
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_140,bVar21,"memory",pcVar38,(Function *)0x0);
        pMVar33 = (puVar48->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        bVar21 = true;
        if (pMVar33->shared == true) {
          bVar21 = (pMVar33->max).addr != 0xffffffffffffffff;
        }
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_140,bVar21,"memory","shared memory must have max size",
                   (Function *)0x0);
        if (((puVar48->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->shared == true) {
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,(bool)((byte)(local_38->features).features & 1),
                     "memory","shared memory requires threads [--enable-threads]",(Function *)0x0);
        }
        puVar48 = puVar48 + 1;
      } while (puVar48 != puVar9);
    }
    puVar40 = (local_38->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar52 = (local_38->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar20 = puVar52;
    if (puVar40 != puVar52) {
      do {
        local_40 = (HeapType *)puVar20;
        pDVar4 = (puVar40->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar4->isPassive == true) {
          ValidationInfo::shouldBeTrue<wasm::Expression*>
                    ((ValidationInfo *)local_140,
                     SUB41(((local_38->features).features & 0x10) >> 4,0),
                     (Expression *)((Type *)&pDVar4->offset)->id,
                     "nonzero segment flags require bulk memory [--enable-bulk-memory]",
                     (Function *)0x0);
          pEVar7 = (Expression *)
                   ((Type *)&((puVar40->_M_t).
                              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                              .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->
                             offset)->id;
          ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Expression*>
                    ((ValidationInfo *)local_140,pEVar7,(Expression *)0x0,pEVar7,
                     "passive segment should not have an offset",(Function *)0x0);
        }
        else {
          ppEVar45 = *(pointer *)
                      ((long)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_> + 8);
          lVar10 = *(long *)&((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               *)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_>)->
                             _M_impl;
          pMVar33 = Module::getMemoryOrNull(local_38,(Name)(pDVar4->memory).super_IString.str);
          bVar21 = ValidationInfo::shouldBeTrue<char_const*>
                             ((ValidationInfo *)local_140,pMVar33 != (Memory *)0x0,"segment",
                              "active segment must have a valid memory name",(Function *)0x0);
          if (bVar21) {
            pEVar7 = (Expression *)
                     ((Type *)&((puVar40->_M_t).
                                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->
                               offset)->id;
            left.id = (pEVar7->type).id;
            if ((pMVar33->indexType).id == 3) {
              bVar21 = ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                                 ((ValidationInfo *)local_140,left,(Type)0x3,pEVar7,
                                  "segment offset should be i64",(Function *)0x0);
            }
            else {
              bVar21 = ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                                 ((ValidationInfo *)local_140,left,(Type)0x2,pEVar7,
                                  "segment offset should be i32",(Function *)0x0);
            }
            if (bVar21 != false) {
              bVar21 = Properties::isValidConstantExpression
                                 (local_38,(Expression *)
                                           ((Type *)&((puVar40->_M_t).
                                                                                                            
                                                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>
                                                  ._M_head_impl)->offset)->id);
              ValidationInfo::shouldBeTrue<wasm::Expression*>
                        ((ValidationInfo *)local_140,bVar21,
                         (Expression *)
                         ((Type *)&((puVar40->_M_t).
                                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)
                                   ->offset)->id,"memory segment offset should be constant",
                         (Function *)0x0);
              ppuVar19 = local_90;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)0x0;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                   (size_t)&local_348;
              local_348._M_allocated_capacity._0_4_ =
                   local_348._M_allocated_capacity._0_4_ & 0xffffff00;
              local_338._0_8_ = (__node_base_ptr)0x0;
              local_338._8_8_ = (Expression **)0x0;
              local_278 = (pointer)0x0;
              pFStack_270 = (Function *)0x0;
              local_338._176_8_ =
                   (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)0x0;
              pTStack_280 = (pointer)0x0;
              type.id = (uintptr_t)local_90;
              local_260 = local_140;
              _Stack_258._M_buckets = &_Stack_258._M_single_bucket;
              _Stack_258._M_bucket_count = 1;
              _Stack_258._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              _Stack_258._M_element_count = 0;
              _Stack_258._M_rehash_policy._M_max_load_factor = 1.0;
              _Stack_258._M_rehash_policy._M_next_resize = 0;
              _Stack_258._M_single_bucket = (__node_base_ptr)0x0;
              local_220._M_buckets = &local_220._M_single_bucket;
              local_220._M_bucket_count = 1;
              local_220._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_220._M_element_count = 0;
              local_220._M_rehash_policy._M_max_load_factor = 1.0;
              local_220._M_rehash_policy._M_next_resize = 0;
              local_220._M_single_bucket = (__node_base_ptr)0x0;
              local_1e8._M_buckets = &local_1e8._M_single_bucket;
              local_1e8._M_bucket_count = 1;
              local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_1e8._M_element_count = 0;
              local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
              local_1e8._M_rehash_policy._M_next_resize = 0;
              local_1e8._M_single_bucket = (__node_base_ptr)0x0;
              local_1b0._M_buckets = &local_1b0._M_single_bucket;
              local_1b0._M_bucket_count = 1;
              local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_1b0._M_element_count = 0;
              local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
              local_1b0._M_rehash_policy._M_next_resize = 0;
              local_1b0._M_single_bucket = (__node_base_ptr)0x0;
              local_178._M_buckets = &local_178._M_single_bucket;
              local_178._M_bucket_count = 1;
              local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_178._M_element_count = 0;
              local_178._M_rehash_policy._M_max_load_factor = 1.0;
              local_178._M_rehash_policy._M_next_resize = 0;
              local_178._M_single_bucket = (__node_base_ptr)0x0;
              local_268 = local_38;
              auStack_88 = (undefined1  [8])
                           ((Type *)&((puVar40->_M_t).
                                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                     _M_head_impl)->offset)->id;
              Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                        ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          *)local_338,(Expression **)auStack_88);
              type.id = (uintptr_t)ppuVar19;
              std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_178);
              std::
              _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_1b0);
              std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_1e8);
              std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_220);
              std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&_Stack_258);
              if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_338._176_8_ !=
                  (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)0x0) {
                operator_delete((void *)local_338._176_8_,(long)local_278 - local_338._176_8_);
              }
              type.id = local_50.id;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index != &local_348) {
                operator_delete((void *)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .index,
                                CONCAT44(local_348._M_allocated_capacity._4_4_,
                                         local_348._M_allocated_capacity._0_4_) + 1);
              }
              puVar52 = (pointer)local_40;
              if ((pMVar33->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
                pDVar4 = (puVar40->_M_t).
                         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                         .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
                ValidationInfo::shouldBeTrue<unsigned_long>
                          ((ValidationInfo *)local_140,
                           (ulong)((long)ppEVar45 - lVar10) <= (pMVar33->initial).addr << 0x10,
                           (long)*(pointer *)
                                  ((long)&(pDVar4->data).
                                          super__Vector_base<char,_std::allocator<char>_> + 8) -
                           *(long *)&((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       *)&(pDVar4->data).
                                          super__Vector_base<char,_std::allocator<char>_>)->_M_impl,
                           "segment size should fit in memory (initial)",(Function *)0x0);
              }
            }
          }
        }
        puVar40 = puVar40 + 1;
        puVar20 = (pointer)local_40;
      } while (puVar40 != puVar52);
    }
    pMVar39 = local_38;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)&local_348;
    local_348._M_allocated_capacity._0_4_ = local_348._M_allocated_capacity._0_4_ & 0xffffff00;
    local_338._0_8_ = (__node_base_ptr)0x0;
    local_338._8_8_ = (Expression **)0x0;
    local_338._176_8_ =
         (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)0x0;
    pTStack_280 = (pointer)0x0;
    local_278 = (pointer)0x0;
    pFStack_270 = (Function *)0x0;
    type.id = (uintptr_t)local_90;
    local_260 = local_140;
    _Stack_258._M_buckets = &_Stack_258._M_single_bucket;
    _Stack_258._M_bucket_count = 1;
    _Stack_258._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    _Stack_258._M_element_count = 0;
    _Stack_258._M_rehash_policy._M_max_load_factor = 1.0;
    _Stack_258._M_rehash_policy._M_next_resize = 0;
    _Stack_258._M_single_bucket = (__node_base_ptr)0x0;
    local_220._M_buckets = &local_220._M_single_bucket;
    local_220._M_bucket_count = 1;
    local_220._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_220._M_element_count = 0;
    local_220._M_rehash_policy._M_max_load_factor = 1.0;
    local_220._M_rehash_policy._M_next_resize = 0;
    local_220._M_single_bucket = (__node_base_ptr)0x0;
    local_1e8._M_buckets = &local_1e8._M_single_bucket;
    local_1e8._M_bucket_count = 1;
    local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1e8._M_element_count = 0;
    local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e8._M_rehash_policy._M_next_resize = 0;
    local_1e8._M_single_bucket = (__node_base_ptr)0x0;
    local_1b0._M_buckets = &local_1b0._M_single_bucket;
    local_1b0._M_bucket_count = 1;
    local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b0._M_element_count = 0;
    local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
    local_1b0._M_rehash_policy._M_next_resize = 0;
    local_1b0._M_single_bucket = (__node_base_ptr)0x0;
    local_178._M_buckets = &local_178._M_single_bucket;
    local_178._M_bucket_count = 1;
    local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_178._M_element_count = 0;
    local_178._M_rehash_policy._M_max_load_factor = 1.0;
    local_178._M_rehash_policy._M_next_resize = 0;
    local_178._M_single_bucket = (__node_base_ptr)0x0;
    local_268 = local_38;
    if (((local_38->features).features & 0x100) == 0) {
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_140,
                 (ulong)((long)(local_38->tables).
                               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_38->tables).
                              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) < 9,"table",
                 "Only 1 table definition allowed in MVP (requires --enable-reference-types)",
                 (Function *)0x0);
      local_48 = (HeapType *)
                 (pMVar39->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pointer)local_48 !=
          (pMVar39->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar8 = local_48->id;
        wasm::Type::Type((Type *)auStack_88,(HeapType)0x1,Nullable);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_140,
                   (undefined1  [8])*(Expression **)(uVar8 + 0x48) == auStack_88,"table",
                   "Only funcref is valid for table type (when reference types are disabled)",
                   (Function *)0x0);
        puVar40 = (pointer)(local_38->elementSegments).
                           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        local_390 = (pointer)(local_38->elementSegments).
                             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar40 != local_390) {
          do {
            ValidationInfo::shouldBeTrue<char_const*>
                      ((ValidationInfo *)local_140,
                       *(char **)((long)&(((puVar40->_M_t).
                                           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                           .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                          _M_head_impl)->memory).super_IString + 8) ==
                       *(char **)(local_48->id + 8),"elem",
                       "all element segments should refer to a single table in MVP.",(Function *)0x0
                      );
            pDVar4 = (puVar40->_M_t).
                     super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
            ppEVar11 = *(pointer *)
                        ((long)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_> + 8);
            local_40 = (HeapType *)puVar40;
            for (ppEVar45 = *(pointer *)
                             &((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                *)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_>)->
                              _M_impl; ppEVar45 != ppEVar11; ppEVar45 = ppEVar45 + 1) {
              pEVar7 = *ppEVar45;
              ValidationInfo::shouldBeTrue<wasm::Expression*>
                        ((ValidationInfo *)local_140,pEVar7->_id == RefFuncId,pEVar7,
                         "all table elements must be non-null funcrefs in MVP.",(Function *)0x0);
              auStack_88 = (undefined1  [8])pEVar7;
              Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                        ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          *)local_338,(Expression **)auStack_88);
            }
            puVar40 = (pointer)(local_40 + 1);
          } while (puVar40 != local_390);
        }
      }
    }
    wasm::Type::Type((Type *)&info.outputs._M_h._M_single_bucket,(HeapType)0x0,Nullable);
    wasm::Type::Type((Type *)local_b0,(HeapType)0x1,Nullable);
    puVar49 = (local_38->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (local_38->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar49 != puVar12) {
      do {
        pTVar34 = (puVar49->_M_t).
                  super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_140,(pTVar34->initial).addr <= (pTVar34->max).addr,
                   "table","size minimum must not be greater than maximum",(Function *)0x0);
        bVar21 = wasm::Type::isNullable
                           (&((puVar49->_M_t).
                              super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_140,bVar21,"table",
                   "Non-nullable reference types are not yet supported for tables",(Function *)0x0);
        if (((local_38->features).features & 0x400) == 0) {
          bVar21 = wasm::Type::isFunction
                             (&((puVar49->_M_t).
                                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
          result = true;
          if (!bVar21) {
            result = (__node_base_ptr)
                     (((puVar49->_M_t).
                       super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id ==
                     info.outputs._M_h._M_single_bucket;
          }
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,result,"table",
                     "Only function reference types or externref are valid for table type (when GC is disabled)"
                     ,(Function *)0x0);
        }
        if (((local_38->features).features & 0x400) == 0) {
          pDVar4 = (DataSegment *)
                   (((puVar49->_M_t).
                     super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                     super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id;
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,
                     pDVar4 == (DataSegment *)info.outputs._M_h._M_single_bucket ||
                     (undefined1  [8])pDVar4 == local_b0,"table",
                     "Only funcref and externref are valid for table type (when gc is disabled)",
                     (Function *)0x0);
        }
        puVar49 = puVar49 + 1;
      } while (puVar49 != puVar12);
    }
    puVar53 = (local_38->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (HeapType *)
               (local_38->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar53 != (pointer)local_40) {
      do {
        pMVar39 = local_38;
        bVar21 = wasm::Type::isRef(&((puVar53->_M_t).
                                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                    _M_head_impl)->type);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_140,bVar21,"elem",
                   "element segment type must be of reference type.",(Function *)0x0);
        bVar21 = wasm::Type::isNullable
                           (&((puVar53->_M_t).
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                             type);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_140,bVar21,"elem",
                   "Non-nullable reference types are not yet supported for tables",(Function *)0x0);
        pEVar13 = (puVar53->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        pcVar38 = *(char **)((long)&(pEVar13->table).super_IString + 8);
        if (pcVar38 == (char *)0x0) {
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,pEVar13->offset == (Expression *)0x0,"elem",
                     "non-table segment offset should have no offset",(Function *)0x0);
        }
        else {
          name_00.super_IString.str._M_str = pcVar38;
          name_00.super_IString.str._M_len = (pEVar13->table).super_IString.str._M_len;
          pTVar34 = Module::getTableOrNull(pMVar39,name_00);
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,pTVar34 != (Table *)0x0,"elem",
                     "element segment must have a valid table name",(Function *)0x0);
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,
                     ((puVar53->_M_t).
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset !=
                     (Expression *)0x0,"elem","table segment offset should have an offset",
                     (Function *)0x0);
          pEVar7 = ((puVar53->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset;
          ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                    ((ValidationInfo *)local_140,(Type)(pEVar7->type).id,(Type)0x2,pEVar7,
                     "element segment offset should be i32",(Function *)0x0);
          bVar21 = Properties::isValidConstantExpression
                             (pMVar39,((puVar53->_M_t).
                                       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                      _M_head_impl)->offset);
          ValidationInfo::shouldBeTrue<wasm::Expression*>
                    ((ValidationInfo *)local_140,bVar21,
                     ((puVar53->_M_t).
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset,
                     "table segment offset should be constant",(Function *)0x0);
          bVar21 = wasm::Type::isSubType
                             ((Type)(((puVar53->_M_t).
                                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                     _M_head_impl)->type).id,(Type)(pTVar34->type).id);
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_140,bVar21,"elem",
                     "element segment type must be a subtype of the table type",(Function *)0x0);
          auStack_88 = (undefined1  [8])
                       ((puVar53->_M_t).
                        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                        .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset;
          Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                    ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      *)local_338,(Expression **)auStack_88);
        }
        pEVar13 = (puVar53->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar11 = *(pointer *)
                    ((long)&(pEVar13->data).
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                    + 8);
        for (ppEVar45 = *(pointer *)
                         &(pEVar13->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl; ppEVar45 != ppEVar11; ppEVar45 = ppEVar45 + 1) {
          pEVar7 = *ppEVar45;
          bVar21 = Properties::isValidConstantExpression(local_38,pEVar7);
          ValidationInfo::shouldBeTrue<wasm::Expression*>
                    ((ValidationInfo *)local_140,bVar21,pEVar7,
                     "element must be a constant expression",(Function *)0x0);
          bVar21 = wasm::Type::isSubType
                             ((Type)(pEVar7->type).id,
                              (Type)(((puVar53->_M_t).
                                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                     _M_head_impl)->type).id);
          if (!bVar21) {
            ValidationInfo::fail<wasm::Expression*,char_const*>
                      ((ValidationInfo *)local_140,"element must be a subtype of the segment type",
                       pEVar7,(Function *)0x0);
          }
          auStack_88 = (undefined1  [8])pEVar7;
          Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                    ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      *)local_338,(Expression **)auStack_88);
        }
        puVar53 = puVar53 + 1;
      } while (puVar53 != (pointer)local_40);
    }
    type.id = (uintptr_t)local_90;
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_178);
    std::
    _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1b0);
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1e8);
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_220);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&_Stack_258);
    if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)local_338._176_8_ !=
        (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      operator_delete((void *)local_338._176_8_,(long)local_278 - local_338._176_8_);
    }
    pMVar39 = local_38;
    type.id = local_50.id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index !=
        &local_348) {
      operator_delete((void *)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,
                      CONCAT44(local_348._M_allocated_capacity._4_4_,
                               local_348._M_allocated_capacity._0_4_) + 1);
    }
    puVar46 = (pMVar39->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (puVar46 !=
        (pMVar39->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ValidationInfo::shouldBeTrue<wasm::Name>
                ((ValidationInfo *)local_140,SUB41(((local_38->features).features & 0x40) >> 6,0),
                 (IString)*(IString *)
                           &(((puVar46->_M_t).
                              super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
                              .super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->
                            super_Importable).super_Named,
                 "Tags require exception-handling [--enable-exception-handling]",(Function *)0x0);
    }
    puVar46 = (local_38->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (HeapType *)
               (local_38->tags).
               super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar46 != (pointer)local_40) {
      do {
        _Var14._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
             (puVar46->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t;
        ValidationInfo::shouldBeEqual<wasm::Name,wasm::Type>
                  ((ValidationInfo *)local_140,
                   (Type)(((IString *)
                          ((long)_Var14._M_t.
                                 super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                 .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x40))->
                         str)._M_len,(Type)0x0,
                   (Name)*(string_view *)
                          _Var14._M_t.
                          super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                          super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl,
                   "Tag type\'s result type should be none",(Function *)0x0);
        bVar21 = wasm::Type::isTuple((Type *)((long)(puVar46->_M_t).
                                                                                                        
                                                  super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                                  ._M_t + 0x38));
        if (bVar21) {
          ValidationInfo::shouldBeTrue<wasm::Name>
                    ((ValidationInfo *)local_140,
                     (bool)((byte)((local_38->features).features >> 9) & 1),
                     (Name)*(string_view *)
                            (puVar46->_M_t).
                            super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t,
                     "Multivalue tag type requires multivalue [--enable-multivalue]",(Function *)0x0
                    );
        }
        pTVar25 = (Type *)((long)(puVar46->_M_t).
                                 super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                                 _M_t + 0x38);
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        type.id = (uintptr_t)pTVar25;
        pTVar24 = (Type *)wasm::Type::size(pTVar25);
        while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                != pTVar24 || ((Type *)type.id != pTVar25))) {
          pTVar35 = wasm::Type::Iterator::operator*((Iterator *)&type);
          ValidationInfo::shouldBeTrue<wasm::Name>
                    ((ValidationInfo *)local_140,1 < pTVar35->id,
                     (Name)*(string_view *)
                            (puVar46->_M_t).
                            super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t,
                     "Values in a tag should have concrete types",(Function *)0x0);
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        }
        puVar46 = puVar46 + 1;
      } while (puVar46 != (pointer)local_40);
    }
    pcVar38 = (local_38->start).super_IString.str._M_str;
    if (pcVar38 != (char *)0x0) {
      name_01.super_IString.str._M_str = pcVar38;
      name_01.super_IString.str._M_len = (local_38->start).super_IString.str._M_len;
      pFVar27 = Module::getFunctionOrNull(local_38,name_01);
      bVar21 = ValidationInfo::shouldBeTrue<wasm::Name>
                         ((ValidationInfo *)local_140,pFVar27 != (Function *)0x0,
                          (Name)(local_38->start).super_IString.str,"start must be found",
                          (Function *)0x0);
      if (bVar21) {
        SVar54 = HeapType::getSignature(&pFVar27->type);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_140,SVar54.params.id.id == 0,
                   (Name)(local_38->start).super_IString.str,"start must have 0 params",
                   (Function *)0x0);
        SVar54 = HeapType::getSignature(&pFVar27->type);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_140,SVar54.results.id.id == 0,
                   (Name)(local_38->start).super_IString.str,"start must not return a value",
                   (Function *)0x0);
      }
    }
    FVar22.features = (local_38->features).features;
    if ((FVar22.features >> 10 & 1) != 0) {
      ValidationInfo::shouldBeTrue<wasm::FeatureSet>
                ((ValidationInfo *)local_140,(bool)((byte)(FVar22.features >> 8) & 1),FVar22,
                 "--enable-gc requires --enable-reference-types",(Function *)0x0);
    }
    if (info.wasm._3_1_ == 1) {
      type.id = (uintptr_t)local_338;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x1;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      local_348._M_allocated_capacity._0_4_ = 0x3f800000;
      local_348._8_8_ = 0;
      local_338._0_8_ = (__node_base_ptr)0x0;
      puVar29 = (local_38->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar15 = (local_38->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar29 != puVar15) {
        do {
          pFVar27 = (puVar29->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if (*(char **)((long)&(pFVar27->super_Importable).module + 8) != (char *)0x0) {
            auStack_88 = (undefined1  [8])&type;
            std::
            _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                      ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&type,&pFVar27->type,auStack_88);
          }
          puVar29 = puVar29 + 1;
        } while (puVar29 != puVar15);
      }
      puVar44 = (local_38->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (local_38->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar44 != puVar5) {
        do {
          pEVar6 = (puVar44->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (pEVar6->kind == Function) {
            pFVar27 = Module::getFunction(local_38,(Name)(pEVar6->value).super_IString.str);
            auStack_88 = (undefined1  [8])&type;
            std::
            _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                      ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&type,&pFVar27->type,auStack_88);
          }
          puVar44 = puVar44 + 1;
        } while (puVar44 != puVar5);
      }
      wasm::ModuleUtils::getPublicHeapTypes(&local_388,local_38);
      local_40 = local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_50.id = (uintptr_t)&local_38->typeNames;
        pHVar41 = local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_370.id = pHVar41->id;
          cVar36 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&type,&local_370);
          if (cVar36.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
            HeapType::toString_abi_cxx11_((string *)auStack_88,&local_370);
            iVar37 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_50.id,&local_370);
            if (iVar37.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur != (__node_type *)0x0) {
              info.outputs._M_h._M_single_bucket = local_c0;
              pp_Var2 = &info.outputs._M_h._M_single_bucket;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)pp_Var2,
                         *(long *)((long)iVar37.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                         ._M_cur + 0x18),
                         *(long *)((long)iVar37.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                         ._M_cur + 0x10) +
                         *(long *)((long)iVar37.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                         ._M_cur + 0x18));
              std::__cxx11::string::operator=((string *)auStack_88,(string *)pp_Var2);
              if (info.outputs._M_h._M_single_bucket != local_c0) {
                operator_delete(info.outputs._M_h._M_single_bucket,
                                (ulong)((long)&(local_c0[0]._M_nxt)->_M_nxt + 1));
              }
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0,"publicly exposed type disallowed with a closed world: $",
                           (string *)auStack_88);
            ValidationInfo::fail<wasm::HeapType,std::__cxx11::string>
                      ((ValidationInfo *)local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,(HeapType)local_370.id,(Function *)0x0);
            if (local_b0 != (undefined1  [8])&stack0xffffffffffffff60) {
              operator_delete((void *)local_b0,local_a0 + 1);
            }
            if (auStack_88 != (undefined1  [8])&name._M_string_length) {
              operator_delete((void *)auStack_88,name._M_string_length + 1);
            }
          }
          pHVar41 = pHVar41 + 1;
        } while (pHVar41 != local_40);
      }
      if (local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_388.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_388.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_388.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&type);
    }
  }
  iVar23 = PassRunner::getPassDebug();
  if (iVar23 != 0) {
    local_338._176_8_ = &_Stack_258;
    type.id = 0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_338._128_8_ = (pointer)0x0;
    local_338._136_8_ = (pointer)0x0;
    local_338._144_8_ = (pointer)0x0;
    local_338._152_8_ = (Function *)0x0;
    local_338._168_8_ = local_140;
    pTStack_280 = (pointer)0x1;
    local_278 = (pointer)0x0;
    pFStack_270 = (Function *)0x0;
    local_268 = (Module *)CONCAT44(local_268._4_4_,0x3f800000);
    local_260 = (undefined1 *)0x0;
    _Stack_258._M_buckets = (__node_base_ptr *)0x0;
    local_338._160_8_ = local_38;
    puVar43 = (local_38->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (local_38->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar43 != puVar3) {
      do {
        pGVar28 = (puVar43->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar28->super_Importable).module + 8) == (char *)0x0) {
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,&pGVar28->init);
        }
        puVar43 = puVar43 + 1;
      } while (puVar43 != puVar3);
    }
    puVar29 = (local_38->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (local_38->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar29 != puVar15) {
      do {
        pFVar27 = (puVar29->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar27->super_Importable).module + 8) == (char *)0x0) {
          local_338._152_8_ = pFVar27;
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,&pFVar27->body);
          local_338._152_8_ = (Function *)0x0;
        }
        puVar29 = puVar29 + 1;
      } while (puVar29 != puVar15);
    }
    puVar53 = (local_38->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (HeapType *)
               (local_38->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar53 != (pointer)local_40) {
      do {
        _Var16._M_t.
        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             (puVar53->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t;
        if (*(long *)((long)_Var16._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                     0x20) != 0) {
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,(Expression **)
                        ((long)_Var16._M_t.
                               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                        0x28));
        }
        plVar17 = *(long **)((long)_Var16._M_t.
                                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                   _M_head_impl + 0x40);
        for (plVar50 = *(long **)((long)_Var16._M_t.
                                        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                        .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                        _M_head_impl + 0x38); plVar50 != plVar17;
            plVar50 = plVar50 + 1) {
          auStack_88 = (undefined1  [8])*plVar50;
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,(Expression **)auStack_88);
        }
        puVar53 = puVar53 + 1;
      } while (puVar53 != (pointer)local_40);
    }
    puVar40 = (local_38->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar52 = (local_38->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar40 != puVar52) {
      do {
        pDVar4 = (puVar40->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar4->isPassive == false) {
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,&pDVar4->offset);
        }
        puVar40 = puVar40 + 1;
      } while (puVar40 != puVar52);
    }
    local_338._160_8_ = (Module *)0x0;
    std::
    _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)(local_338 + 0xb0));
    if ((pointer)local_338._128_8_ != (pointer)0x0) {
      operator_delete((void *)local_338._128_8_,local_338._144_8_ - local_338._128_8_);
    }
  }
  if (((info.wasm._4_1_ & 1) == 0) && (info.wasm._2_1_ == 0)) {
    puVar29 = (local_38->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (local_38->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar29 != puVar15) {
      do {
        ValidationInfo::getStream_abi_cxx11_
                  ((ValidationInfo *)local_140,
                   (puVar29->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)type.id,
                   (long)__begin3.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)
        ;
        if ((size_t *)type.id !=
            &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)type.id,
                          __begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        puVar29 = puVar29 + 1;
      } while (puVar29 != puVar15);
    }
    ValidationInfo::getStream_abi_cxx11_((ValidationInfo *)local_140,(Function *)0x0);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)type.id,
               (long)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent);
    if ((size_t *)type.id !=
        &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
      operator_delete((void *)type.id,
                      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index + 1);
    }
  }
  bVar42 = info.wasm._4_1_;
  PassRunner::~PassRunner(&local_4a8);
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&info.mutex.super___mutex_base._M_mutex.__data.__list.__next);
  return (bool)(bVar42 & 1);
}

Assistant:

bool WasmValidator::validate(Module& module, Flags flags) {
  ValidationInfo info(module);
  info.validateWeb = (flags & Web) != 0;
  info.validateGlobally = (flags & Globally) != 0;
  info.quiet = (flags & Quiet) != 0;
  info.closedWorld = (flags & ClosedWorld) != 0;
  // parallel wasm logic validation
  PassRunner runner(&module);
  FunctionValidator(module, &info).validate(&runner);
  // validate globally
  if (info.validateGlobally) {
    validateImports(module, info);
    validateExports(module, info);
    validateGlobals(module, info);
    validateMemories(module, info);
    validateDataSegments(module, info);
    validateTables(module, info);
    validateTags(module, info);
    validateModule(module, info);
    validateFeatures(module, info);
    if (info.closedWorld) {
      validateClosedWorldInterface(module, info);
    }
  }
  // validate additional internal IR details when in pass-debug mode
  if (PassRunner::getPassDebug()) {
    validateBinaryenIR(module, info);
  }
  // print all the data
  if (!info.valid.load() && !info.quiet) {
    for (auto& func : module.functions) {
      std::cerr << info.getStream(func.get()).str();
    }
    std::cerr << info.getStream(nullptr).str();
  }
  return info.valid.load();
}